

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O0

bool cfd::core::AbstractTransaction::GetVariableInt
               (uint8_t *p_byte_data,size_t data_size,uint64_t *p_result,size_t *p_size)

{
  uint64_t v64;
  uint32_t v32;
  uint16_t v16;
  bool is_success;
  size_t *p_size_local;
  uint64_t *p_result_local;
  size_t data_size_local;
  uint8_t *p_byte_data_local;
  
  v64._7_1_ = false;
  if (((p_byte_data != (uint8_t *)0x0) && (p_size != (size_t *)0x0)) && (data_size != 0)) {
    if (*p_byte_data < 0xfd) {
      *p_size = 1;
      *p_result = (ulong)*p_byte_data;
      v64._7_1_ = true;
    }
    else if (*p_byte_data == 0xfd) {
      v64._7_1_ = 2 < data_size;
      if (v64._7_1_) {
        *p_result = (ulong)*(ushort *)(p_byte_data + 1);
        *p_size = 3;
      }
    }
    else if (*p_byte_data == 0xfe) {
      v64._7_1_ = 4 < data_size;
      if (v64._7_1_) {
        *p_result = (ulong)*(uint *)(p_byte_data + 1);
        *p_size = 5;
      }
    }
    else {
      v64._7_1_ = 8 < data_size;
      if (v64._7_1_) {
        *p_result = *(uint64_t *)(p_byte_data + 1);
        *p_size = 9;
      }
    }
  }
  return v64._7_1_;
}

Assistant:

bool AbstractTransaction::GetVariableInt(
    const uint8_t *p_byte_data, size_t data_size, uint64_t *p_result,
    size_t *p_size) {
  bool is_success = false;
  if ((p_byte_data == nullptr) || (p_size == nullptr) || (data_size < 1)) {
    // do nothing
  } else if (*p_byte_data <= kViMax8) {
    *p_size = 1;
    *p_result = *p_byte_data;
    is_success = true;
  } else if (*p_byte_data == kViTag16) {
    if (data_size >= (sizeof(uint16_t) + 1)) {
      uint16_t v16;
      memcpy(&v16, &p_byte_data[1], sizeof(v16));
      *p_result = v16;
      *p_size = sizeof(v16) + 1;
      is_success = true;
    }
  } else if (*p_byte_data == kViTag32) {
    if (data_size >= (sizeof(uint32_t) + 1)) {
      uint32_t v32;
      memcpy(&v32, &p_byte_data[1], sizeof(v32));
      *p_result = v32;
      *p_size = sizeof(v32) + 1;
      is_success = true;
    }
  } else {
    if (data_size >= (sizeof(uint64_t) + 1)) {
      uint64_t v64;
      memcpy(&v64, &p_byte_data[1], sizeof(v64));
      *p_result = v64;
      *p_size = sizeof(v64) + 1;
      is_success = true;
    }
  }
  return is_success;
}